

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall ArgWrapper<char>::ArgWrapper<char_const*>(ArgWrapper<char> *this,char *in_args)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7e;
  undefined1 local_7d;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [40];
  char *local_18;
  char *in_args_local;
  ArgWrapper<char> *this_local;
  
  local_7d = 1;
  local_68 = &local_60;
  local_18 = in_args;
  in_args_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,in_args,&local_69);
  local_7d = 0;
  local_40._0_8_ = &local_60;
  local_40._8_8_ = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_7e);
  __l._M_len = local_40._8_8_;
  __l._M_array = (iterator)local_40._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_40 + 0x10),__l,&local_7e);
  ArgWrapper(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_40 + 0x10));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_40 + 0x10));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_7e);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  do {
    local_b0 = local_b0 + -1;
    std::__cxx11::string::~string((string *)local_b0);
  } while (local_b0 != &local_60);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

ArgWrapper(Args... in_args)
		: ArgWrapper{ std::vector<std::basic_string<CharT>>{ in_args... } } {
		// Empty ctor body
	}